

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guard.h
# Opt level: O2

void __thiscall Guard::Guard(Guard *this,function<void_()> *enter,function<void_()> *leave)

{
  std::function<void_()>::function(&this->leave_,leave);
  std::function<void_()>::operator()(enter);
  return;
}

Assistant:

Guard(const std::function<void ()> &enter,
          const std::function<void ()> &leave)
    : leave_(leave)
    {
        enter();
    }